

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_rawsetp(lua_State *L,int idx,void *p)

{
  TValue *pTVar1;
  TValue *pTVar2;
  StkId pTVar3;
  TValue *io;
  TValue k;
  Value local_28;
  undefined4 local_20;
  
  pTVar1 = index2addr(L,idx);
  local_20 = 2;
  pTVar3 = L->top;
  local_28.p = p;
  pTVar2 = luaH_set(L,&((pTVar1->value_).gc)->h,(TValue *)&local_28);
  pTVar2->value_ = pTVar3[-1].value_;
  pTVar2->tt_ = pTVar3[-1].tt_;
  pTVar3 = L->top;
  if ((((pTVar3[-1].tt_ & 0x40) != 0) && (((byte)pTVar3[-1].value_.f[9] & 3) != 0)) &&
     (((((pTVar1->value_).gc)->gch).marked & 4) != 0)) {
    luaC_barrierback_(L,(pTVar1->value_).gc);
    pTVar3 = L->top;
  }
  L->top = pTVar3 + -1;
  return;
}

Assistant:

LUA_API void lua_rawsetp (lua_State *L, int idx, const void *p) {
  StkId t;
  TValue k;
  lua_lock(L);
  api_checknelems(L, 1);
  t = index2addr(L, idx);
  api_check(L, ttistable(t), "table expected");
  setpvalue(&k, cast(void *, p));
  setobj2t(L, luaH_set(L, hvalue(t), &k), L->top - 1);
  luaC_barrierback(L, gcvalue(t), L->top - 1);
  L->top--;
  lua_unlock(L);
}